

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O0

Pool<Tag,_8192UL> * __thiscall
entityx::EntityManager::accomodate_component<Tag>(EntityManager *this)

{
  Family __n;
  size_type sVar1;
  reference ppBVar2;
  value_type pBVar3;
  reference ppBVar4;
  value_type __s;
  long in_RDI;
  ComponentHelper<Tag> *helper;
  Pool<Tag,_8192UL> *pool;
  Family family;
  size_t in_stack_ffffffffffffff98;
  BasePool *in_stack_ffffffffffffffa0;
  value_type *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
  *in_stack_ffffffffffffffd0;
  
  __n = component_family<Tag>();
  sVar1 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::size
                    ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                     (in_RDI + 0x18));
  if (sVar1 <= __n) {
    Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::resize
              ((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
               in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  ppBVar2 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
            operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                       (in_RDI + 0x18),__n);
  if (*ppBVar2 == (value_type)0x0) {
    pBVar3 = (value_type)operator_new(0x40);
    Pool<Tag,_8192UL>::Pool((Pool<Tag,_8192UL> *)in_stack_ffffffffffffffa0);
    BasePool::expand(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ppBVar2 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
              operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                         (in_RDI + 0x18),__n);
    *ppBVar2 = pBVar3;
  }
  sVar1 = Catch::clara::std::
          vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::
          size((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                *)(in_RDI + 0x30));
  if (sVar1 <= __n) {
    Catch::clara::std::
    vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>::resize
              (in_stack_ffffffffffffffd0,0,(value_type *)in_stack_ffffffffffffffc0);
  }
  ppBVar4 = Catch::clara::std::
            vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
            ::operator[]((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                          *)(in_RDI + 0x30),__n);
  if (*ppBVar4 == (value_type)0x0) {
    __s = (value_type)operator_new(8);
    memset(__s,0,8);
    ComponentHelper<Tag>::ComponentHelper((ComponentHelper<Tag> *)in_stack_ffffffffffffffa0);
    ppBVar4 = Catch::clara::std::
              vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
              ::operator[]((vector<entityx::BaseComponentHelper_*,_std::allocator<entityx::BaseComponentHelper_*>_>
                            *)(in_RDI + 0x30),__n);
    *ppBVar4 = __s;
  }
  ppBVar2 = Catch::clara::std::vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_>::
            operator[]((vector<entityx::BasePool_*,_std::allocator<entityx::BasePool_*>_> *)
                       (in_RDI + 0x18),__n);
  return (Pool<Tag,_8192UL> *)*ppBVar2;
}

Assistant:

Pool<C> *accomodate_component() {
    BaseComponent::Family family = component_family<C>();
    if (component_pools_.size() <= family) {
      component_pools_.resize(family + 1, nullptr);
    }
    if (!component_pools_[family]) {
      Pool<C> *pool = new Pool<C>();
      pool->expand(index_counter_);
      component_pools_[family] = pool;
    }
    if (component_helpers_.size() <= family) {
      component_helpers_.resize(family + 1, nullptr);
    }
    if (!component_helpers_[family]) {
      ComponentHelper<C> *helper = new ComponentHelper<C>();
      component_helpers_[family] = helper;
    }
    return static_cast<Pool<C>*>(component_pools_[family]);
  }